

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<float&,float&,std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&>
               (string *s,char *fmt,float *v,float *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               float *args_2,float *args_3,float *args_4,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
               float *args_6,float *args_7,float *args_8)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *in_RCX;
  string *in_RDX;
  string *in_RDI;
  float *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  float *unaff_R14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R15;
  float *unaff_retaddr;
  float *in_stack_00000008;
  float *in_stack_00000010;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd60;
  char **in_stack_fffffffffffffd68;
  char **in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  string local_270 [32];
  undefined8 local_250;
  string local_248 [32];
  char *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffde8;
  LogLevel in_stack_fffffffffffffdf4;
  float in_stack_fffffffffffffe3c;
  string local_a0 [53];
  byte local_6b;
  byte local_6a;
  byte local_69;
  string local_68 [16];
  float *in_stack_ffffffffffffffa8;
  float *in_stack_ffffffffffffffb0;
  
  copyToFormatString(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  lVar2 = std::__cxx11::string::find((char)local_68,0x2a);
  local_69 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_68,0x73);
  local_6a = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_68,100);
  local_6b = lVar2 != -1;
  if ((local_69 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
             in_stack_fffffffffffffdd8);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffe3c);
    std::__cxx11::string::operator+=(in_RDI,local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  else {
    if ((local_6b & 1) != 0) {
      LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
               in_stack_fffffffffffffdd8);
    }
    if ((local_6a & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                 in_stack_fffffffffffffdd8);
      }
      std::__cxx11::string::c_str();
      formatOne<float&>(in_stack_fffffffffffffd78,(float *)in_stack_fffffffffffffd70);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd70);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffdd8);
      std::ostream::operator<<(&stack0xfffffffffffffde8,*(float *)in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_250 = std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      std::__cxx11::string::operator+=(in_RDI,local_248);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffdd8);
    }
  }
  stringPrintfRecursive<float&,std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,unaff_R14
             ,unaff_R15,unaff_retaddr,in_stack_00000008,in_stack_00000010);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}